

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  stbi_uc *psVar5;
  byte *pbVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001ab437;
    psVar5 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar5;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar5;
      s->img_buffer_end = psVar5 + iVar3;
    }
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != 'G') goto LAB_001ab437;
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001ab437;
    psVar5 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar5;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar5;
      s->img_buffer_end = psVar5 + iVar3;
    }
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != 'I') goto LAB_001ab437;
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001ab437;
    psVar5 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar5;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar5;
      s->img_buffer_end = psVar5 + iVar3;
    }
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != 'F') goto LAB_001ab437;
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001ab437;
    psVar5 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar5;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar5;
      s->img_buffer_end = psVar5 + iVar3;
    }
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != '8') goto LAB_001ab437;
  psVar5 = s->img_buffer;
  if (psVar5 < s->img_buffer_end) {
LAB_001ab330:
    s->img_buffer = psVar5 + 1;
    sVar1 = *psVar5;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar5 = s->buffer_start;
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar5;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar5;
        s->img_buffer_end = psVar5 + iVar3;
      }
      psVar5 = s->img_buffer;
      goto LAB_001ab330;
    }
    sVar1 = '\0';
  }
  if ((sVar1 != '7') && (sVar1 != '9')) goto LAB_001ab437;
  psVar5 = s->img_buffer;
  if (psVar5 < s->img_buffer_end) {
LAB_001ab3ba:
    s->img_buffer = psVar5 + 1;
    bVar7 = *psVar5 == 'a';
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar5 = s->buffer_start;
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar5;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar5;
        s->img_buffer_end = psVar5 + iVar3;
      }
      psVar5 = s->img_buffer;
      goto LAB_001ab3ba;
    }
    bVar7 = false;
  }
  if (!bVar7) {
LAB_001ab437:
    *(char **)(in_FS_OFFSET + -0x10) = "not GIF";
    return 0;
  }
  *(char **)(in_FS_OFFSET + -0x10) = "";
  iVar3 = stbi__get16le(s);
  g->w = iVar3;
  iVar3 = stbi__get16le(s);
  g->h = iVar3;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_001ab480:
    s->img_buffer = pbVar6 + 1;
    uVar4 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar5 = s->buffer_start;
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar5;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar5;
        s->img_buffer_end = psVar5 + iVar3;
      }
      pbVar6 = s->img_buffer;
      goto LAB_001ab480;
    }
    uVar4 = 0;
  }
  g->flags = uVar4;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_001ab4fe:
    s->img_buffer = pbVar6 + 1;
    uVar4 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar5 = s->buffer_start;
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar5;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar5;
        s->img_buffer_end = psVar5 + iVar3;
      }
      pbVar6 = s->img_buffer;
      goto LAB_001ab4fe;
    }
    uVar4 = 0;
  }
  g->bgindex = uVar4;
  pbVar6 = s->img_buffer;
  if (s->img_buffer_end <= pbVar6) {
    if (s->read_from_callbacks == 0) {
      uVar4 = 0;
      goto LAB_001ab58a;
    }
    psVar5 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar5;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar5;
      s->img_buffer_end = psVar5 + iVar3;
    }
    pbVar6 = s->img_buffer;
  }
  s->img_buffer = pbVar6 + 1;
  uVar4 = (uint)*pbVar6;
LAB_001ab58a:
  g->ratio = uVar4;
  g->transparent = -1;
  if (comp != (int *)0x0) {
    *comp = 4;
  }
  if (is_info != 0) {
    return 1;
  }
  bVar2 = (byte)g->flags;
  if (-1 < (char)bVar2) {
    return 1;
  }
  stbi__gif_parse_colortable(s,g->pal,2 << (bVar2 & 7),-1);
  return 1;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}